

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O3

int stun_attr_xor_sockaddr_add(stun_msg_hdr *msg_hdr,uint16_t type,sockaddr *addr)

{
  int iVar1;
  ushort uVar2;
  uint8_t *begin;
  ulong uVar3;
  
  uVar3 = (ulong)(ushort)(msg_hdr->length << 8 | msg_hdr->length >> 8);
  iVar1 = stun_attr_xor_sockaddr_init
                    ((stun_attr_xor_sockaddr *)(msg_hdr[1].tsx_id + (uVar3 - 8)),type,addr,msg_hdr);
  if (iVar1 == 0) {
    uVar2 = ((*(ushort *)(msg_hdr[1].tsx_id + (uVar3 - 6)) << 8 |
             *(ushort *)(msg_hdr[1].tsx_id + (uVar3 - 6)) >> 8) + 3 & 0xfffc) +
            (msg_hdr->length << 8 | msg_hdr->length >> 8) + 4;
    msg_hdr->length = uVar2 * 0x100 | uVar2 >> 8;
  }
  return iVar1;
}

Assistant:

int stun_attr_xor_sockaddr_add(stun_msg_hdr *msg_hdr,
                               uint16_t type, const struct sockaddr *addr) {
  stun_attr_xor_sockaddr *attr =
      (stun_attr_xor_sockaddr *)stun_msg_end(msg_hdr);
  int status = stun_attr_xor_sockaddr_init(attr, type, addr, msg_hdr);
  if (status != STUN_OK)
    return status;
  stun_msg_add_attr(msg_hdr, &attr->hdr);
  return STUN_OK;
}